

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O1

void __thiscall irr::gui::IGUIElement::draw(IGUIElement *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[0xd])();
  if ((char)iVar1 != '\0') {
    for (p_Var2 = (this->Children).
                  super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 != (_List_node_base *)&this->Children; p_Var2 = p_Var2->_M_next) {
      (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))();
    }
  }
  return;
}

Assistant:

virtual void draw()
	{
		if (isVisible()) {
			for (auto child : Children)
				child->draw();
		}
	}